

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NavierStokesBase.cpp
# Opt level: O1

void __thiscall NavierStokesBase::buildMetrics(NavierStokesBase *this)

{
  Geometry *this_00;
  char cVar1;
  BoxArray *pBVar2;
  MultiFab *pMVar3;
  FabArray<amrex::FArrayBox> *this_01;
  int dir;
  long lVar4;
  FabFactory<amrex::FArrayBox> local_1c8;
  DistributionMapping *local_1c0;
  undefined1 local_1b8 [16];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1a8 [15];
  
  pMVar3 = &this->volume;
  amrex::FabArray<amrex::FArrayBox>::clear(&pMVar3->super_FabArray<amrex::FArrayBox>);
  local_1c0 = &(this->super_AmrLevel).dmap;
  local_1b8._0_8_ = (MultiCutFab *)0x1;
  local_1b8._8_8_ = (MultiCutFab *)0x0;
  local_1a8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_1a8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1a8[0].
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c8._vptr_FabFactory = (_func_int **)&PTR__FabFactory_0074e8d0;
  amrex::MultiFab::define
            (pMVar3,&(this->super_AmrLevel).grids,local_1c0,1,1,(MFInfo *)local_1b8,&local_1c8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(local_1a8);
  this_00 = &(this->super_AmrLevel).geom;
  amrex::Geometry::GetVolume(this_00,pMVar3);
  this_01 = (FabArray<amrex::FArrayBox> *)&this->field_0x540;
  lVar4 = 0;
  do {
    amrex::FabArray<amrex::FArrayBox>::clear(this_01);
    pBVar2 = amrex::AmrLevel::getEdgeBoxArray(&this->super_AmrLevel,(int)lVar4);
    local_1b8._0_8_ = (MultiCutFab *)0x1;
    local_1a8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_1a8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1b8._8_8_ = (MultiCutFab *)0x0;
    local_1a8[0].
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_1c8._vptr_FabFactory = (_func_int **)&PTR__FabFactory_0074e8d0;
    (*(this_01->super_FabArrayBase)._vptr_FabArrayBase[2])
              (this_01,pBVar2,local_1c0,1,1,local_1b8,&local_1c8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(local_1a8);
    amrex::Geometry::GetFaceArea(this_00,(MultiFab *)this_01,(int)lVar4);
    lVar4 = lVar4 + 1;
    this_01 = this_01 + 1;
  } while (lVar4 != 3);
  lVar4 = 0;
  do {
    if ((this->super_AmrLevel).geom.super_CoordSys.dx[0] * 1e-12 <
        ABS((this->super_AmrLevel).geom.super_CoordSys.dx[lVar4 + 1] -
            (this->super_AmrLevel).geom.super_CoordSys.dx[lVar4])) {
      local_1b8._8_8_ = amrex::OutStream();
      local_1b8._4_4_ = *(undefined4 *)(DAT_00756620 + -0x48);
      local_1b8._0_4_ = *(undefined4 *)(DAT_00756620 + -0x30);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
      *(undefined8 *)
       ((long)&local_1a8[0].
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish +
       (long)(((MultiCutFab *)
              ((long)local_1a8[0].
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start + -0x188))->m_data).pcd._M_t.
             super___uniq_ptr_impl<amrex::PCData<amrex::CutFab>,_std::default_delete<amrex::PCData<amrex::CutFab>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_amrex::PCData<amrex::CutFab>_*,_std::default_delete<amrex::PCData<amrex::CutFab>_>_>
             .super__Head_base<0UL,_amrex::PCData<amrex::CutFab>_*,_false>._M_head_impl) =
           *(undefined8 *)
            ((long)&(((FabArray<amrex::CutFab> *)local_1b8._8_8_)->super_FabArrayBase).boxarray.
                    m_bat.m_bat_type +
            (long)(((FabArray<amrex::CutFab> *)local_1b8._8_8_)->super_FabArrayBase).
                  _vptr_FabArrayBase[-3]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"dx = ",5);
      std::ostream::_M_insert<double>((this->super_AmrLevel).geom.super_CoordSys.dx[0]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      std::ostream::_M_insert<double>((this->super_AmrLevel).geom.super_CoordSys.dx[1]);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," ",1);
      std::ostream::_M_insert<double>((this->super_AmrLevel).geom.super_CoordSys.dx[2]);
      cVar1 = (char)(ostringstream *)local_1a8;
      std::ios::widen((char)(((MultiCutFab *)
                             ((long)local_1a8[0].
                                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start + -0x188))->m_data).
                            pcd._M_t.
                            super___uniq_ptr_impl<amrex::PCData<amrex::CutFab>,_std::default_delete<amrex::PCData<amrex::CutFab>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_amrex::PCData<amrex::CutFab>_*,_std::default_delete<amrex::PCData<amrex::CutFab>_>_>
                            .super__Head_base<0UL,_amrex::PCData<amrex::CutFab>_*,_false>.
                            _M_head_impl + cVar1);
      std::ostream::put(cVar1);
      std::ostream::flush();
      amrex::Print::~Print((Print *)local_1b8);
      amrex::Abort_host("EB requires dx == dy (== dz)\n");
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 2);
  lVar4 = __dynamic_cast((this->super_AmrLevel).m_factory._M_t.
                         super___uniq_ptr_impl<amrex::FabFactory<amrex::FArrayBox>,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_std::default_delete<amrex::FabFactory<amrex::FArrayBox>_>_>
                         .super__Head_base<0UL,_amrex::FabFactory<amrex::FArrayBox>_*,_false>.
                         _M_head_impl,&amrex::FabFactory<amrex::FArrayBox>::typeinfo,
                         &amrex::EBFArrayBoxFactory::typeinfo,0);
  if (lVar4 != 0) {
    pMVar3 = amrex::EBDataCollection::getVolFrac(*(EBDataCollection **)(lVar4 + 0xd8));
    this->volfrac = pMVar3;
    amrex::EBDataCollection::getAreaFrac(*(EBDataCollection **)(lVar4 + 0xd8));
    (this->areafrac)._M_elems[2] =
         (MultiCutFab *)
         local_1a8[0].
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start;
    (this->areafrac)._M_elems[0] = (MultiCutFab *)local_1b8._0_8_;
    (this->areafrac)._M_elems[1] = (MultiCutFab *)local_1b8._8_8_;
    return;
  }
  __cxa_bad_cast();
}

Assistant:

void
NavierStokesBase::buildMetrics ()
{
    //
    // We "should" only need radius when we're RZ, but some 2-D code is written to
    // access it first and then "use" if if RZ.  It's easier to just always build
    // it for 2D than try to fix the underlying Fortran calls that take radius.
    //
#if (AMREX_SPACEDIM == 2)
    radius.resize(grids.size());

    const Real dxr = geom.CellSize()[0];

    for (int i = 0; i < grids.size(); i++)
    {
        const int ilo = grids[i].smallEnd(0)-radius_grow;
        const int ihi = grids[i].bigEnd(0)+radius_grow;
        const int len = ihi - ilo + 1;

        radius[i].resize(len);

        RealBox gridloc = RealBox(grids[i],geom.CellSize(),geom.ProbLo());

        const Real xlo = gridloc.lo(0) + (0.5 - radius_grow)*dxr;
        for (int j = 0; j < len; j++) {
            radius[i][j] = xlo + j*dxr;
        }
    }
#endif

    // volume and area are intentionally without EB knowledge
    volume.clear();
    volume.define(grids,dmap,1,GEOM_GROW);
    geom.GetVolume(volume);

    for (int dir = 0; dir < AMREX_SPACEDIM; ++dir)
    {
        area[dir].clear();
        area[dir].define(getEdgeBoxArray(dir),dmap,1,GEOM_GROW);
        geom.GetFaceArea(area[dir],dir);
    }

#ifdef AMREX_USE_EB
    // make sure dx == dy == dz
    const Real* dx = geom.CellSize();
    for (int i = 1; i < AMREX_SPACEDIM; i++){
        if (std::abs(dx[i]-dx[i-1]) > 1.e-12*dx[0]){
            Print()<<"dx = "
                   <<AMREX_D_TERM(dx[0], <<" "<<dx[1], <<" "<<dx[2])
                   <<std::endl;
            amrex::Abort("EB requires dx == dy (== dz)\n");
        }
    }

    const auto& ebfactory = dynamic_cast<EBFArrayBoxFactory const&>(Factory());
    volfrac = &(ebfactory.getVolFrac());
    areafrac = ebfactory.getAreaFrac();

#endif
}